

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-misc.c
# Opt level: O1

void do_cmd_wizard(void)

{
  uint32_t *puVar1;
  player_upkeep *ppVar2;
  _Bool _Var3;
  char *fmt;
  
  if ((player->noscore & 2) == 0) {
    msg("You are about to enter \'wizard\' mode for the very first time!");
    msg("This is a form of cheating, and your game will not be scored!");
    event_signal(EVENT_MESSAGE_FLUSH);
    _Var3 = get_check("Are you sure you want to enter wizard mode? ");
    if (!_Var3) {
      return;
    }
    player->noscore = player->noscore | 2;
  }
  fmt = "Wizard mode on.";
  if (player->wizard != false) {
    fmt = "Wizard mode off.";
  }
  player->wizard = (_Bool)(player->wizard ^ 1);
  msg(fmt);
  ppVar2 = player->upkeep;
  puVar1 = &ppVar2->update;
  *puVar1 = *puVar1 | 0x80;
  puVar1 = &ppVar2->redraw;
  *(byte *)puVar1 = (byte)*puVar1 | 2;
  return;
}

Assistant:

void do_cmd_wizard(void)
{
	/* Verify first time */
	if (!(player->noscore & NOSCORE_WIZARD)) {
		/* Mention effects */
		msg("You are about to enter 'wizard' mode for the very first time!");
		msg("This is a form of cheating, and your game will not be scored!");
		event_signal(EVENT_MESSAGE_FLUSH);

		/* Verify request */
		if (!get_check("Are you sure you want to enter wizard mode? "))
			return;

		/* Mark savefile */
		player->noscore |= NOSCORE_WIZARD;
	}

	/* Toggle mode */
	if (player->wizard) {
		player->wizard = false;
		msg("Wizard mode off.");
	} else {
		player->wizard = true;
		msg("Wizard mode on.");
	}

	/* Update monsters */
	player->upkeep->update |= (PU_MONSTERS);

	/* Redraw "title" */
	player->upkeep->redraw |= (PR_TITLE);
}